

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sOcclusionQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::OcclusionQueryStressCase::init
          (OcclusionQueryStressCase *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  bool bVar2;
  GLenum err;
  int extraout_EAX;
  ShaderProgram *this_00;
  RenderContext *renderCtx;
  TestLog *log;
  TestError *this_01;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  ProgramSources local_100;
  char *local_20;
  char *fragShaderSource;
  char *vertShaderSource;
  OcclusionQueryStressCase *this_local;
  
  fragShaderSource =
       "#version 300 es\nlayout(location = 0) in mediump vec4 a_position;\n\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
  ;
  local_20 = 
  "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nuniform mediump vec4 u_color;\n\nvoid main (void)\n{\n\tmediump float depth_gradient = gl_FragCoord.z;\n\tmediump float bias = 0.1;\n\tdEQP_FragColor = vec4(u_color.xyz * (depth_gradient + bias), 1.0);\n}\n"
  ;
  vertShaderSource = (char *)this;
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = Context::getRenderContext((this->super_TestCase).m_context);
  pcVar1 = fragShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,pcVar1,&local_121);
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,pcVar1,&local_149);
  glu::makeVtxFragSources(&local_100,&local_120,&local_148);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_100);
  this->m_program = this_00;
  glu::ProgramSources::~ProgramSources(&local_100);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  bVar2 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar2) {
    log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::operator<<(log,this->m_program);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sOcclusionQueryTests.cpp"
               ,0x84);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  err = glwGetError();
  glu::checkError(err,"Case initialization finished",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sOcclusionQueryTests.cpp"
                  ,0x88);
  return extraout_EAX;
}

Assistant:

void OcclusionQueryStressCase::init (void)
{
	const char*	vertShaderSource =
				"#version 300 es\n"
				"layout(location = 0) in mediump vec4 a_position;\n"
				"\n"
				"void main (void)\n"
				"{\n"
				"	gl_Position = a_position;\n"
				"}\n";

	const char* fragShaderSource =
				"#version 300 es\n"
				"layout(location = 0) out mediump vec4 dEQP_FragColor;\n"
				"uniform mediump vec4 u_color;\n"
				"\n"
				"void main (void)\n"
				"{\n"
				"	mediump float depth_gradient = gl_FragCoord.z;\n"
				"	mediump float bias = 0.1;\n"
				"	dEQP_FragColor = vec4(u_color.xyz * (depth_gradient + bias), 1.0);\n"
				"}\n";

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertShaderSource, fragShaderSource));

	if (!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;
		TCU_FAIL("Failed to compile shader program");
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass"); // Initialize test result to pass.
	GLU_CHECK_MSG ("Case initialization finished");
}